

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O2

void plain_array_suite::assign_iterator(void)

{
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  initializer_list<int> __l_02;
  initializer_list<int> __l_03;
  initializer_list<int> __l_04;
  initializer_list<int> __l_05;
  initializer_list<int> __l_06;
  initializer_list<int> __l_07;
  initializer_list<int> __l_08;
  iterator iVar1;
  iterator iVar2;
  allocator_type local_e1;
  vector<int,_std::allocator<int>_> input;
  int local_c8 [8];
  circular_view<int,_18446744073709551615UL> span;
  int array [4];
  
  span.member.data = array;
  array[0] = 0;
  array[1] = 0;
  array[2] = 0;
  array[3] = 0;
  span.member.cap = 4;
  span.member.size = 0;
  span.member.next = 4;
  local_c8[0] = 0xb;
  __l._M_len = 1;
  __l._M_array = local_c8;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             &input.super__Vector_base<int,_std::allocator<int>_>,__l,&local_e1);
  vista::circular_view<int,18446744073709551615ul>::
  assign<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            (&span,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                   input.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             input.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&input.super__Vector_base<int,_std::allocator<int>_>);
  local_c8[0] = 0xb;
  __l_00._M_len = 1;
  __l_00._M_array = local_c8;
  std::vector<int,_std::allocator<int>_>::vector(&input,__l_00,&local_e1);
  iVar1 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x757,"void plain_array_suite::assign_iterator()",iVar1,iVar2,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             input.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      input.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&input.super__Vector_base<int,_std::allocator<int>_>);
  local_c8[0] = 0x15;
  local_c8[1] = 0x16;
  __l_01._M_len = 2;
  __l_01._M_array = local_c8;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             &input.super__Vector_base<int,_std::allocator<int>_>,__l_01,&local_e1);
  vista::circular_view<int,18446744073709551615ul>::
  assign<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            (&span,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                   input.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             input.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&input.super__Vector_base<int,_std::allocator<int>_>);
  local_c8[0] = 0x15;
  local_c8[1] = 0x16;
  __l_02._M_len = 2;
  __l_02._M_array = local_c8;
  std::vector<int,_std::allocator<int>_>::vector(&input,__l_02,&local_e1);
  iVar1 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x760,"void plain_array_suite::assign_iterator()",iVar1,iVar2,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             input.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      input.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&input.super__Vector_base<int,_std::allocator<int>_>);
  local_c8[0] = 0x1f;
  local_c8[1] = 0x20;
  local_c8[2] = 0x21;
  __l_03._M_len = 3;
  __l_03._M_array = local_c8;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             &input.super__Vector_base<int,_std::allocator<int>_>,__l_03,&local_e1);
  vista::circular_view<int,18446744073709551615ul>::
  assign<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            (&span,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                   input.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             input.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&input.super__Vector_base<int,_std::allocator<int>_>);
  local_c8[0] = 0x1f;
  local_c8[1] = 0x20;
  local_c8[2] = 0x21;
  __l_04._M_len = 3;
  __l_04._M_array = local_c8;
  std::vector<int,_std::allocator<int>_>::vector(&input,__l_04,&local_e1);
  iVar1 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x769,"void plain_array_suite::assign_iterator()",iVar1,iVar2,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             input.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      input.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&input.super__Vector_base<int,_std::allocator<int>_>);
  local_c8[0] = 0x29;
  local_c8[1] = 0x2a;
  local_c8[2] = 0x2b;
  local_c8[3] = 0x2c;
  __l_05._M_len = 4;
  __l_05._M_array = local_c8;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             &input.super__Vector_base<int,_std::allocator<int>_>,__l_05,&local_e1);
  vista::circular_view<int,18446744073709551615ul>::
  assign<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            (&span,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                   input.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             input.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&input.super__Vector_base<int,_std::allocator<int>_>);
  local_c8[0] = 0x29;
  local_c8[1] = 0x2a;
  local_c8[2] = 0x2b;
  local_c8[3] = 0x2c;
  __l_06._M_len = 4;
  __l_06._M_array = local_c8;
  std::vector<int,_std::allocator<int>_>::vector(&input,__l_06,&local_e1);
  iVar1 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x772,"void plain_array_suite::assign_iterator()",iVar1,iVar2,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             input.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      input.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&input.super__Vector_base<int,_std::allocator<int>_>);
  local_c8[0] = 0x33;
  local_c8[1] = 0x34;
  local_c8[2] = 0x35;
  local_c8[3] = 0x36;
  local_c8[4] = 0x37;
  __l_07._M_len = 5;
  __l_07._M_array = local_c8;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             &input.super__Vector_base<int,_std::allocator<int>_>,__l_07,&local_e1);
  vista::circular_view<int,18446744073709551615ul>::
  assign<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            (&span,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                   input.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             input.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&input.super__Vector_base<int,_std::allocator<int>_>);
  local_c8[0] = 0x34;
  local_c8[1] = 0x35;
  local_c8[2] = 0x36;
  local_c8[3] = 0x37;
  __l_08._M_len = 4;
  __l_08._M_array = local_c8;
  std::vector<int,_std::allocator<int>_>::vector(&input,__l_08,&local_e1);
  iVar1 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0x77b,"void plain_array_suite::assign_iterator()",iVar1,iVar2,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             input.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      input.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&input.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void assign_iterator()
{
    int array[4] = {};
    circular_view<int> span(array);
    {
        std::vector<int> input = { 11 };
        span.assign(input.begin(), input.end());
    }
    {
        std::vector<int> expect = { 11 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    {
        std::vector<int> input = { 21, 22 };
        span.assign(input.begin(), input.end());
    }
    {
        std::vector<int> expect = { 21, 22 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    {
        std::vector<int> input = { 31, 32, 33 };
        span.assign(input.begin(), input.end());
    }
    {
        std::vector<int> expect = { 31, 32, 33 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    {
        std::vector<int> input = { 41, 42, 43, 44 };
        span.assign(input.begin(), input.end());
    }
    {
        std::vector<int> expect = { 41, 42, 43, 44 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
    {
        std::vector<int> input = { 51, 52, 53, 54, 55 };
        span.assign(input.begin(), input.end());
    }
    {
        std::vector<int> expect = { 52, 53, 54, 55 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
    }
}